

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItemGroup::addToGroup(QGraphicsItemGroup *this,QGraphicsItem *item)

{
  double dVar1;
  double dVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  TransformData *pTVar5;
  long lVar6;
  qreal *pqVar7;
  undefined4 *puVar8;
  qreal *pqVar9;
  QTransform *pQVar10;
  undefined4 *puVar11;
  QGraphicsTransform **ppQVar12;
  long lVar13;
  long in_FS_OFFSET;
  byte bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  qreal qVar17;
  qreal qVar18;
  QPointF QVar19;
  bool ok;
  QMatrix4x4 m;
  QTransform newItemTransform;
  QTransform itemTransform;
  QArrayData *local_260;
  double local_258;
  double local_248;
  QRectF local_228;
  QRectF local_208;
  QRectF local_1e8;
  bool local_1c1;
  QRectF local_1c0 [2];
  undefined4 local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined8 local_154;
  undefined8 uStack_14c;
  undefined4 local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  QTransform local_128;
  QTransform local_d8;
  qreal local_88 [10];
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    addToGroup();
  }
  else if (item == &this->super_QGraphicsItem) {
    addToGroup();
  }
  else {
    pQVar3 = (this->super_QGraphicsItem).d_ptr.d;
    local_1c1 = true;
    pqVar7 = (qreal *)&DAT_00700eb8;
    pqVar9 = local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pqVar9 = *pqVar7;
      pqVar7 = pqVar7 + 1;
      pqVar9 = pqVar9 + 1;
    }
    QGraphicsItem::itemTransform((QTransform *)local_88,item,&this->super_QGraphicsItem,&local_1c1);
    if (local_1c1 == false) {
      addToGroup();
    }
    else {
      pqVar7 = (qreal *)&DAT_00700eb8;
      pQVar10 = &local_d8;
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = *pqVar7;
        pqVar7 = pqVar7 + (ulong)bVar14 * -2 + 1;
        pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pqVar7 = local_88;
      pQVar10 = &local_d8;
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = *pqVar7;
        pqVar7 = pqVar7 + (ulong)bVar14 * -2 + 1;
        pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      local_128.m_matrix[0][0] = 0.0;
      local_128.m_matrix[0][1] = 0.0;
      QVar19 = QGraphicsItem::mapFromItem(&this->super_QGraphicsItem,item,(QPointF *)&local_128);
      local_128.m_matrix[0][0] = QVar19.xp;
      local_128.m_matrix[0][1] = QVar19.yp;
      QGraphicsItem::setPos(item,(QPointF *)&local_128);
      QGraphicsItem::setParentItem(item,&this->super_QGraphicsItem);
      pQVar4 = (item->d_ptr).d;
      dVar1 = (pQVar4->pos).xp;
      dVar2 = (pQVar4->pos).yp;
      if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) || (NAN(dVar2))) {
        QTransform::fromTranslate(-dVar1,-dVar2);
        QTransform::operator*=(&local_d8,&local_128);
      }
      pTVar5 = ((item->d_ptr).d)->transformData;
      if (pTVar5 == (TransformData *)0x0) {
        local_248 = 0.0;
        local_258 = 0.0;
      }
      else {
        local_258 = pTVar5->xOrigin;
        local_248 = pTVar5->yOrigin;
      }
      puVar8 = &DAT_00700e70;
      puVar11 = &local_16c;
      for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar11 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
      }
      local_16c = 0x3f800000;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0x3f800000;
      local_154 = 0;
      uStack_14c = 0;
      local_144 = 0x3f800000;
      local_140 = 0;
      uStack_138 = 0;
      local_130 = 0x3f800000;
      if (pTVar5 == (TransformData *)0x0) {
        local_260 = (QArrayData *)0x0;
        ppQVar12 = (QGraphicsTransform **)0x0;
        lVar6 = 0;
      }
      else {
        local_260 = &((pTVar5->graphicsTransforms).d.d)->super_QArrayData;
        ppQVar12 = (pTVar5->graphicsTransforms).d.ptr;
        lVar6 = (pTVar5->graphicsTransforms).d.size;
        if (local_260 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_260->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_260->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      if (lVar6 != 0) {
        lVar13 = 0;
        do {
          (**(code **)(*(long *)ppQVar12[lVar13] + 0x60))(ppQVar12[lVar13],&local_16c);
          lVar13 = lVar13 + 1;
        } while (lVar6 != lVar13);
      }
      QMatrix4x4::toTransform();
      QTransform::inverted((bool *)&local_128);
      QTransform::operator*=(&local_d8,&local_128);
      QTransform::translate(local_258,local_248);
      pTVar5 = ((item->d_ptr).d)->transformData;
      if (pTVar5 == (TransformData *)0x0) {
        uVar15 = 0;
        uVar16 = 0;
      }
      else {
        qVar17 = pTVar5->rotation;
        uVar15 = SUB84(qVar17,0);
        uVar16 = (undefined4)((ulong)qVar17 >> 0x20);
      }
      QTransform::rotate(-(double)CONCAT44(uVar16,uVar15),(Axis)&local_d8);
      pTVar5 = ((item->d_ptr).d)->transformData;
      qVar17 = 1.0;
      if (pTVar5 != (TransformData *)0x0) {
        qVar17 = pTVar5->scale;
      }
      qVar18 = 1.0;
      if (pTVar5 != (TransformData *)0x0) {
        qVar18 = pTVar5->scale;
      }
      QTransform::scale(1.0 / qVar17,1.0 / qVar18);
      QTransform::translate(-local_258,-local_248);
      QGraphicsItem::setTransform(item,&local_d8,false);
      QGraphicsItemPrivate::setIsMemberOfGroup((item->d_ptr).d,true);
      QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
      (*item->_vptr_QGraphicsItem[3])(&local_208,item);
      QGraphicsItem::childrenBoundingRect(&local_228,item);
      QRectF::operator|(&local_1e8,&local_208);
      QTransform::mapRect(local_1c0);
      QRectF::operator|((QRectF *)&local_128,(QRectF *)(pQVar3 + 1));
      pQVar3[1].extras.d.ptr = (ExtraStruct *)local_128.m_matrix[0][2];
      pQVar3[1].extras.d.size = (qsizetype)local_128.m_matrix[1][0];
      pQVar3[1]._vptr_QGraphicsItemPrivate = (_func_int **)local_128.m_matrix[0][0];
      pQVar3[1].extras.d.d = (Data *)local_128.m_matrix[0][1];
      local_128.m_matrix[0][2] = 0.0;
      local_128.m_matrix[1][0] = 0.0;
      local_128.m_matrix[0][0] = 0.0;
      local_128.m_matrix[0][1] = 0.0;
      QGraphicsItem::update(&this->super_QGraphicsItem,(QRectF *)&local_128);
      if (local_260 != (QArrayData *)0x0) {
        LOCK();
        (local_260->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_260->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_260->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_260,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemGroup::addToGroup(QGraphicsItem *item)
{
    Q_D(QGraphicsItemGroup);
    if (!item) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add a group to itself");
        return;
    }

    // COMBINE
    bool ok;
    QTransform itemTransform = item->itemTransform(this, &ok);

    if (!ok) {
        qWarning("QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates");
        return;
    }

    QTransform newItemTransform(itemTransform);
    item->setPos(mapFromItem(item, 0, 0));
    item->setParentItem(this);

    // removing position from translation component of the new transform
    if (!item->pos().isNull())
        newItemTransform *= QTransform::fromTranslate(-item->x(), -item->y());

    // removing additional transformations properties applied with itemTransform()
    QPointF origin = item->transformOriginPoint();
    QMatrix4x4 m;
    QList<QGraphicsTransform*> transformList = item->transformations();
    for (int i = 0; i < transformList.size(); ++i)
        transformList.at(i)->applyTo(&m);
    newItemTransform *= m.toTransform().inverted();
    newItemTransform.translate(origin.x(), origin.y());
    newItemTransform.rotate(-item->rotation());
    newItemTransform.scale(1/item->scale(), 1/item->scale());
    newItemTransform.translate(-origin.x(), -origin.y());

    // ### Expensive, we could maybe use dirtySceneTransform bit for optimization

    item->setTransform(newItemTransform);
    item->d_func()->setIsMemberOfGroup(true);
    prepareGeometryChange();
    d->itemsBoundingRect |= itemTransform.mapRect(item->boundingRect() | item->childrenBoundingRect());
    update();
}